

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singular_scalar.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::rust::(anonymous_namespace)::UpbCTypeNameForFunctions_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field)

{
  CppType CVar1;
  LogMessage *pLVar2;
  char *local_60;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  LogMessageFatal local_48 [20];
  Voidify local_34;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  _anonymous_namespace_ *local_18;
  FieldDescriptor *field_local;
  
  local_18 = this;
  field_local = (FieldDescriptor *)__return_storage_ptr__;
  CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)this);
  switch(CVar1) {
  case CPPTYPE_INT32:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Int32",&local_19);
    std::allocator<char>::~allocator(&local_19);
    break;
  case CPPTYPE_INT64:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Int64",local_2d);
    std::allocator<char>::~allocator(local_2d);
    break;
  case CPPTYPE_UINT32:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"UInt32",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
    break;
  case CPPTYPE_UINT64:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"UInt64",&local_2f);
    std::allocator<char>::~allocator(&local_2f);
    break;
  case CPPTYPE_DOUBLE:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Double",&local_30);
    std::allocator<char>::~allocator(&local_30);
    break;
  case CPPTYPE_FLOAT:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Float",&local_31);
    std::allocator<char>::~allocator(&local_31);
    break;
  case CPPTYPE_BOOL:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Bool",&local_32);
    std::allocator<char>::~allocator(&local_32);
    break;
  case CPPTYPE_ENUM:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Int32",&local_33);
    std::allocator<char>::~allocator(&local_33);
    break;
  case CPPTYPE_STRING:
  case CPPTYPE_MESSAGE:
  default:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,"false");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/rust/accessors/singular_scalar.cc"
               ,0x36,local_58._M_len,local_58._M_str);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_48);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [24])"Unexpected field type: ");
    local_60 = FieldDescriptor::cpp_type_name((FieldDescriptor *)local_18);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<<const_char_*,_0>
                       (pLVar2,&local_60);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_34,pLVar2);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string UpbCTypeNameForFunctions(const FieldDescriptor& field) {
  switch (field.cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return "Int32";
    case FieldDescriptor::CPPTYPE_INT64:
      return "Int64";
    case FieldDescriptor::CPPTYPE_UINT32:
      return "UInt32";
    case FieldDescriptor::CPPTYPE_UINT64:
      return "UInt64";
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return "Double";
    case FieldDescriptor::CPPTYPE_FLOAT:
      return "Float";
    case FieldDescriptor::CPPTYPE_BOOL:
      return "Bool";
    case FieldDescriptor::CPPTYPE_ENUM:
      return "Int32";
    case FieldDescriptor::CPPTYPE_STRING:
    case FieldDescriptor::CPPTYPE_MESSAGE:
      // Handled by a different file.
      break;
  }
  ABSL_CHECK(false) << "Unexpected field type: " << field.cpp_type_name();
  return "";
}